

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void laguerre_poly_coef(int n,double *c)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  
  if (-1 < n) {
    uVar2 = (ulong)(uint)n;
    lVar1 = uVar2 + 1;
    lVar5 = 0;
    lVar8 = lVar1;
    pdVar4 = c;
    pdVar7 = c;
    do {
      do {
        *pdVar4 = 0.0;
        lVar8 = lVar8 + -1;
        pdVar4 = pdVar4 + uVar2 + 1;
      } while (lVar8 != 0);
      lVar5 = lVar5 + 1;
      pdVar4 = pdVar7 + 1;
      lVar8 = lVar1;
      pdVar7 = pdVar4;
    } while (lVar5 != lVar1);
    lVar8 = 0;
    do {
      c[lVar8] = 1.0;
      lVar8 = lVar8 + 1;
    } while (lVar1 != lVar8);
    if ((n != 0) && (c[uVar2 + 2] = -1.0, 1 < n)) {
      lVar8 = (long)(int)lVar1;
      pdVar4 = c + 1;
      lVar5 = 2;
      do {
        iVar3 = (int)lVar5;
        uVar6 = uVar2;
        pdVar7 = pdVar4;
        do {
          pdVar7[lVar8 + 1] =
               ((pdVar7[lVar8] * (double)(iVar3 * 2 + -1) + pdVar7[lVar8 + -1] * (double)(1 - iVar3)
                ) - *pdVar7) / (double)iVar3;
          pdVar7 = pdVar7 + lVar8;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        lVar5 = lVar5 + 1;
        pdVar4 = pdVar4 + 1;
      } while (lVar5 != lVar1);
    }
  }
  return;
}

Assistant:

void laguerre_poly_coef ( int n, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_POLY_COEF evaluates the Laguerre polynomial coefficients.
//
//  First terms:
//
//    0: 1
//    1: 1  -1
//    2: 1  -2  1/2
//    3: 1  -3  3/2  1/6
//    4: 1  -4  4   -2/3  1/24
//    5: 1  -5  5   -5/3  5/24  -1/120
//
//  Recursion:
//
//    L(0) = ( 1,  0, 0, ..., 0 )
//    L(1) = ( 1, -1, 0, ..., 0 )
//    L(N) = (2*N-1-X) * L(N-1) - (N-1) * L(N-2) / N
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    01 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Output, double C[(N+1)*(N+1)], the coefficients of the Laguerre 
//    polynomials of degree 0 through N.  Each polynomial is stored as a row.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  for ( i = 0; i <= n; i++ )
  {
    c[i+0*(n+1)] = 1.0;
  }

  if ( n == 0 )
  {
    return;
  }

  c[1+1*(n+1)] = -1.0;

  for ( i = 2; i <= n; i++ )
  {
    for ( j = 1; j <= n; j++ )
    {
      c[i+j*(n+1)] = ( 
          double( 2 * i - 1 ) * c[i-1+j*(n+1)] 
        + double(   - i + 1 ) * c[i-2+j*(n+1)] 
        -                          c[i-1+(j-1)*(n+1)] ) 
        / double(i);
    }
 
  }

  return;
}